

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O0

void __thiscall FSAOHDist_NECOF::~FSAOHDist_NECOF(FSAOHDist_NECOF *this)

{
  value_type puVar1;
  pointer pSVar2;
  size_type sVar3;
  size_type sVar4;
  reference ppuVar5;
  FactoredStateAOHDistribution *in_RDI;
  Index agI_1;
  size_t *sz_arr;
  Index agI;
  size_t nrAg;
  size_type in_stack_ffffffffffffffa8;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *in_stack_ffffffffffffffb0
  ;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *in_stack_ffffffffffffffc0
  ;
  uint local_24;
  uint local_14;
  
  in_RDI->_vptr_FactoredStateAOHDistribution = (_func_int **)&PTR__FSAOHDist_NECOF_00d329f0;
  sVar3 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::size
                    ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                     (in_RDI + 4));
  sVar4 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                    ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)(in_RDI + 0x10));
  if (sVar4 == sVar3) {
    for (local_14 = 0; local_14 < sVar3; local_14 = local_14 + 1) {
      ppuVar5 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                          ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)
                           (in_RDI + 0x10),(ulong)local_14);
      puVar1 = *ppuVar5;
      if ((puVar1 != (value_type)0x0) && (puVar1 != (value_type)0x0)) {
        operator_delete__(puVar1);
      }
    }
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::clear
              ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)0x9c927d);
  }
  for (local_24 = 0; local_24 < sVar3; local_24 = local_24 + 1) {
    in_stack_ffffffffffffffc0 =
         (vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
         std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pSVar2 = (((_Vector_base<Scope,_std::allocator<Scope>_> *)
              &in_stack_ffffffffffffffc0->
               super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>)
             ->_M_impl).super__Vector_impl_data._M_start;
    if (pSVar2 != (pointer)0x0) {
      (*(*(_func_int ***)
          &(pSVar2->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data)[1])();
    }
  }
  if (in_RDI[3]._vptr_FactoredStateAOHDistribution != (_func_int **)0x0) {
    (**(code **)(*in_RDI[3]._vptr_FactoredStateAOHDistribution + 8))();
  }
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)in_stack_ffffffffffffffc0)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffc0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffffc0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffffc0);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~vector
            (in_stack_ffffffffffffffc0);
  FactoredStateAOHDistribution::~FactoredStateAOHDistribution(in_RDI);
  return;
}

Assistant:

FSAOHDist_NECOF::~FSAOHDist_NECOF()
{
    size_t nrAg = _m_oHistConditional.size();
    if(_m_stepsize.size()== nrAg)
    {
        for( Index agI=0; agI < nrAg; agI++)    
        {
            size_t * sz_arr = _m_stepsize[agI];
            if( sz_arr != 0)
                delete [] sz_arr;
        }
        _m_stepsize.clear();
    }

    for(Index agI=0; agI < nrAg; agI++)
        delete _m_oHistConditional.at(agI);

    delete _m_sfacMarginals;
}